

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_debug.c
# Opt level: O0

void log_message(int log_level,char *function,char *file,int line,char *template,...)

{
  char in_AL;
  size_t sVar1;
  size_t sVar2;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [40];
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  char *local_70;
  char *message_str;
  va_list arg_list;
  char *output;
  char *new_output;
  char *pcStack_38;
  _Bool log_message;
  char *message_type;
  char *template_local;
  int line_local;
  char *file_local;
  char *function_local;
  int log_level_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_100 = in_R9;
  if ((uint)log_level < 5) {
    pcStack_38 = "ERROR";
    new_output._7_1_ = true;
  }
  else if (log_level - 5U < 2) {
    pcStack_38 = "INFO";
    new_output._7_1_ = get_log_mode();
  }
  else {
    pcStack_38 = "DEBUG";
    new_output._7_1_ = get_log_mode();
  }
  if (new_output._7_1_ != false) {
    output = (char *)0x0;
    arg_list[0].reg_save_area = (void *)0x0;
    create_output_header((char **)&arg_list[0].reg_save_area,pcStack_38,function,file,line);
    if (arg_list[0].reg_save_area != (void *)0x0) {
      local_70 = (char *)0x0;
      arg_list[0].overflow_arg_area = local_128;
      arg_list[0]._0_8_ = &stack0x00000008;
      message_str._4_4_ = 0x30;
      message_str._0_4_ = 0x28;
      vasprintf(&local_70,template,&message_str);
      if (local_70 == (char *)0x0) {
        fprintf(_stderr,"vasprintf failed!\n");
        fflush(_stderr);
        free(arg_list[0].reg_save_area);
      }
      else {
        sVar1 = strlen(local_70);
        sVar2 = strlen((char *)arg_list[0].reg_save_area);
        output = (char *)malloc(sVar1 + sVar2 + 1);
        if (output == (char *)0x0) {
          fprintf(_stderr,"malloc failed!\n");
          fflush(_stderr);
          free(local_70);
          free(arg_list[0].reg_save_area);
          return;
        }
        *output = '\0';
        strcat(output,(char *)arg_list[0].reg_save_area);
        strcat(output,local_70);
        free(local_70);
        free(arg_list[0].reg_save_area);
      }
      if ((uint)log_level < 5) {
        fprintf(_stderr,"%s\n",output);
        fflush(_stderr);
      }
      else {
        fprintf(_stdout,"%s\n",output);
        fflush(_stdout);
      }
    }
    syslog(log_level,"%s",output);
    free(output);
  }
  return;
}

Assistant:

void log_message(int log_level,
                 const char *function,
                 const char *file,
                 int line,
                 const char *template, ...) {

    char *message_type = NULL;
    bool log_message;

    switch (log_level) {
        case LOG_EMERG:
        case LOG_ALERT:
        case LOG_CRIT:
        case LOG_ERR:
        case LOG_WARNING:
            message_type = "ERROR";
            log_message = true;
            break;
        case LOG_NOTICE:
        case LOG_INFO:
            message_type = "INFO";
            log_message = get_log_mode();
            break;

        case LOG_DEBUG:
        default:
            message_type = "DEBUG";
            log_message = get_log_mode();
            break;
    }

    if (log_message) {
        char *new_output = NULL;
        char *output = NULL;
        create_output_header(&output, message_type, function, file, line);

        if (output) {
            va_list arg_list;
            char *message_str = NULL;

            va_start(arg_list, template);
            vasprintf(&message_str, template, arg_list);
            va_end(arg_list);

            if (message_str) {
                if ((new_output = malloc(strlen(message_str) + strlen(output) + 1)) != NULL) {
                    new_output[0] = '\0';   // ensures the memory is an empty string
                    strcat(new_output, output);
                    strcat(new_output, message_str);
                    free(message_str);
                    free(output);
                } else {
                    fprintf(stderr, "malloc failed!\n");
                    fflush(stderr);
                    free(message_str);
                    free(output);
                    return;
                }
            } else {
                fprintf(stderr, "vasprintf failed!\n");
                fflush(stderr);
                free(output);
            }

            switch (log_level) {
                case LOG_EMERG:
                case LOG_ALERT:
                case LOG_CRIT:
                case LOG_ERR:
                case LOG_WARNING:
                    fprintf(stderr, "%s\n", new_output);
                    fflush(stderr);
                    break;

                case LOG_NOTICE:
                case LOG_INFO:
                case LOG_DEBUG:
                default:
                    fprintf(stdout, "%s\n", new_output);
                    fflush(stdout);
                    break;
            }
        }

        syslog(log_level, "%s", new_output);

        free(new_output);
    }
}